

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

void WScriptJsrt::SetExceptionIf(JsErrorCode errorCode,LPCWSTR errorMessage)

{
  char *content;
  char *content_00;
  JsErrorCode JVar1;
  int iVar2;
  HRESULT HVar3;
  size_t sVar4;
  char *local_48;
  char *errorMessageNarrow;
  char *outOfMemoryString;
  JsValueRef pvStack_30;
  JsErrorCode errCode;
  JsValueRef errorMessageString;
  JsValueRef errorObject;
  LPCWSTR pWStack_18;
  bool hasException;
  LPCWSTR errorMessage_local;
  JsErrorCode errorCode_local;
  
  if (errorCode != JsNoError) {
    errorObject._7_1_ = 0;
    pWStack_18 = errorMessage;
    errorMessage_local._4_4_ = errorCode;
    JVar1 = ChakraRTInterface::JsHasException((bool *)((long)&errorObject + 7));
    if ((JVar1 != JsNoError) || ((errorObject._7_1_ & 1) == 0)) {
      iVar2 = PAL_wcscmp(pWStack_18,L"");
      if (iVar2 == 0) {
        pWStack_18 = ConvertErrorCodeToMessage(errorMessage_local._4_4_);
      }
      outOfMemoryString._4_4_ = 0;
      errorMessageNarrow = "Failed to convert wide string. Out of memory?";
      HVar3 = utf8::WideStringToNarrowDynamic(pWStack_18,&local_48);
      content_00 = errorMessageNarrow;
      content = local_48;
      if (HVar3 < 0) {
        sVar4 = strlen(errorMessageNarrow);
        outOfMemoryString._4_4_ =
             ChakraRTInterface::JsCreateString(content_00,sVar4,&stack0xffffffffffffffd0);
      }
      else {
        sVar4 = strlen(local_48);
        outOfMemoryString._4_4_ =
             ChakraRTInterface::JsCreateString(content,sVar4,&stack0xffffffffffffffd0);
        free(local_48);
      }
      ChakraRTInterface::JsCreateError(pvStack_30,&errorMessageString);
      ChakraRTInterface::JsSetException(errorMessageString);
    }
  }
  return;
}

Assistant:

void WScriptJsrt::SetExceptionIf(JsErrorCode errorCode, LPCWSTR errorMessage)
{
    if (errorCode != JsNoError)
    {
        // If the exception is already is set - no need to create a new exception.
        bool hasException = false;
        if (!(ChakraRTInterface::JsHasException(&hasException) == JsNoError && hasException))
        {
            JsValueRef errorObject;
            JsValueRef errorMessageString;

            if (wcscmp(errorMessage, _u("")) == 0)
            {
                errorMessage = ConvertErrorCodeToMessage(errorCode);
            }

            ERROR_MESSAGE_TO_STRING(errCode, errorMessage, errorMessageString);

            ChakraRTInterface::JsCreateError(errorMessageString, &errorObject);
            ChakraRTInterface::JsSetException(errorObject);
        }
    }
}